

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

bool __thiscall CHud::IsLargeWarmupTimerShown(CHud *this)

{
  long lVar1;
  bool bVar2;
  int64 iVar3;
  int64 iVar4;
  
  bVar2 = CMotd::IsActive(((this->super_CComponent).m_pClient)->m_pMotd);
  if (((!bVar2) &&
      (bVar2 = CScoreboard::IsActive(((this->super_CComponent).m_pClient)->m_pScoreboard), !bVar2))
     && (bVar2 = CStats::IsActive(((this->super_CComponent).m_pClient)->m_pStats), !bVar2)) {
    if (this->m_WarmupHideTick != 0) {
      iVar3 = time_get();
      lVar1 = this->m_WarmupHideTick;
      iVar4 = time_freq();
      return (iVar3 - lVar1) / iVar4 < 10;
    }
    return true;
  }
  return false;
}

Assistant:

bool CHud::IsLargeWarmupTimerShown()
{
	return !m_pClient->m_pMotd->IsActive()
		&& !m_pClient->m_pScoreboard->IsActive()
		&& !m_pClient->m_pStats->IsActive()
		&& (m_WarmupHideTick == 0 || (time_get() - m_WarmupHideTick) / time_freq() < 10); // inactivity based
}